

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

int __thiscall libtorrent::aux::piece_picker::piece_size(piece_picker *this,piece_index_t p)

{
  int iVar1;
  int iVar2;
  int64_t size;
  int64_t size_except_last;
  int pieces;
  piece_picker *this_local;
  piece_index_t p_local;
  
  this_local._0_4_ = p.m_val;
  iVar1 = num_pieces(this);
  iVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)&this_local);
  if (iVar2 == iVar1 + -1) {
    this_local._4_4_ = (int)this->m_total_size - (iVar1 + -1) * this->m_piece_size;
  }
  else {
    this_local._4_4_ = this->m_piece_size;
  }
  return this_local._4_4_;
}

Assistant:

int piece_picker::piece_size(piece_index_t const p) const
	{
		int const pieces = num_pieces();
		if (static_cast<int>(p) != pieces - 1)
			return m_piece_size;

		std::int64_t const size_except_last
			= (pieces - 1) * std::int64_t(m_piece_size);
		std::int64_t const size = m_total_size - size_except_last;
		return int(size);
	}